

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_device.cpp
# Opt level: O2

void embree::ISPCScene::updateLight<embree::SceneGraph::DistantLight>(DistantLight *in,Light *out)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined1 auVar5 [16];
  float fVar9;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_28;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_18;
  undefined1 auVar10 [16];
  
  fVar4 = (in->D).field_0.m128[0];
  fVar1 = (in->D).field_0.m128[1];
  fVar2 = (in->D).field_0.m128[2];
  fVar3 = (in->D).field_0.m128[3];
  fVar6 = fVar1 * fVar1;
  fVar7 = fVar2 * fVar2;
  fVar8 = fVar3 * fVar3;
  fVar9 = fVar6 + fVar4 * fVar4 + fVar7;
  auVar10._0_8_ = CONCAT44(fVar6 + fVar6 + fVar8,fVar9);
  auVar10._8_4_ = fVar6 + fVar7 + fVar7;
  auVar10._12_4_ = fVar6 + fVar8 + fVar8;
  auVar5._8_4_ = auVar10._8_4_;
  auVar5._0_8_ = auVar10._0_8_;
  auVar5._12_4_ = auVar10._12_4_;
  auVar5 = rsqrtss(auVar5,auVar10);
  fVar6 = auVar5._0_4_;
  fVar6 = fVar6 * fVar6 * fVar9 * -0.5 * fVar6 + fVar6 * 1.5;
  local_18.m128[0] = -fVar4 * fVar6;
  local_18.m128[1] = -fVar1 * fVar6;
  local_18.m128[2] = -fVar2 * fVar6;
  local_18.m128[3] = -fVar3 * fVar6;
  fVar4 = (1.0 - in->cosHalfAngle) * 6.2831855;
  auVar5 = rcpss(ZEXT416((uint)fVar4),ZEXT416((uint)fVar4));
  fVar4 = (2.0 - fVar4 * auVar5._0_4_) * auVar5._0_4_;
  auVar5 = rcpss(ZEXT416((uint)fVar4),ZEXT416((uint)fVar4));
  fVar4 = (2.0 - fVar4 * auVar5._0_4_) * auVar5._0_4_;
  local_28.m128[0] = fVar4 * (in->L).field_0.m128[0];
  local_28.m128[1] = fVar4 * (in->L).field_0.m128[1];
  local_28.m128[2] = fVar4 * (in->L).field_0.m128[2];
  local_28.m128[3] = fVar4 * (in->L).field_0.m128[3];
  DirectionalLight_set(out,(Vec3fa *)&local_18.field_1,(Vec3fa *)&local_28.field_1,in->cosHalfAngle)
  ;
  return;
}

Assistant:

void ISPCScene::updateLight(const SceneGraph::DistantLight& in, Light* out)
  {
    DirectionalLight_set(out,
                         -normalize(in.D),
                         in.L * rcp(uniformSampleConePDF(in.cosHalfAngle)),
                         in.cosHalfAngle);
  }